

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

transformation_t *
opengv::point_cloud::threept_arun
          (transformation_t *__return_storage_ptr__,PointCloudAdapterBase *adapter,Indices *indices)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  size_t i;
  size_t sVar5;
  long lVar6;
  undefined1 in_ZMM0 [64];
  translation_t translation;
  MatrixXd Hcross;
  point_t pointsCenter2;
  rotation_t rotation;
  Vector3d fprime;
  point_t pointsCenter1;
  undefined1 local_48 [24];
  
  sVar1 = indices->_numberCorrespondences;
  rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter1,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&rotation);
  rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter2,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&rotation);
  lVar6 = 0;
  for (sVar5 = 0; sVar1 != sVar5; sVar5 = sVar5 + 1) {
    iVar4 = (int)sVar5;
    iVar3 = iVar4;
    if (indices->_useIndices != false) {
      iVar3 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar6 >> 0x1e));
    }
    (*adapter->_vptr_PointCloudAdapterBase[2])
              ((DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&rotation,adapter,(long)iVar3);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter1,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&rotation);
    if (indices->_useIndices != false) {
      iVar4 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar6 >> 0x1e));
    }
    (*adapter->_vptr_PointCloudAdapterBase[3])
              ((DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&rotation,adapter,(long)iVar4);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter2,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&rotation);
    lVar6 = lVar6 + 0x100000000;
  }
  auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,sVar1);
  rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&pointsCenter1;
  rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       auVar2._0_8_;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)&pointsCenter1,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&rotation);
  rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&pointsCenter2;
  rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       auVar2._0_8_;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[0],(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)&rotation);
  rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)CONCAT44(rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[0]._4_4_,3);
  fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)CONCAT44(fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[0]._4_4_,3);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&Hcross,(int *)&rotation,(int *)&fprime);
  rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&Hcross,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
              *)&rotation);
  lVar6 = 0;
  for (sVar5 = 0; sVar1 != sVar5; sVar5 = sVar5 + 1) {
    iVar4 = (int)sVar5;
    iVar3 = iVar4;
    if (indices->_useIndices != false) {
      iVar3 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar6 >> 0x1e));
    }
    (*adapter->_vptr_PointCloudAdapterBase[2])
              ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&translation,adapter,(long)iVar3);
    fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         (double)&pointsCenter1;
    fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         (double)&translation;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&rotation,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&fprime);
    if (indices->_useIndices != false) {
      iVar4 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar6 >> 0x1e));
    }
    (*adapter->_vptr_PointCloudAdapterBase[3])(local_48,adapter,(long)iVar4);
    translation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [1] = (double)&pointsCenter2;
    translation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [0] = (double)local_48;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&fprime,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&translation);
    translation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [1] = (double)&rotation;
    translation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [0] = (double)&fprime;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Hcross,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&translation);
    lVar6 = lVar6 + 0x100000000;
  }
  math::arun(&rotation,&Hcross);
  fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&pointsCenter1;
  fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)&pointsCenter2;
  fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)&rotation;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&translation,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
              *)&fprime);
  fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)__return_storage_ptr__;
  fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)__return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>,Eigen::Matrix<double,3,3,0,3,3>>
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)&fprime,&rotation);
  fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)((__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.array
               + 9);
  fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)__return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)&fprime,&translation);
  Eigen::internal::handmade_aligned_free
            (Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
  return __return_storage_ptr__;
}

Assistant:

transformation_t threept_arun(
    const PointCloudAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 2);

  //derive the centroid of the two point-clouds
  point_t pointsCenter1 = Eigen::Vector3d::Zero();
  point_t pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    pointsCenter1 += adapter.getPoint1(indices[i]);
    pointsCenter2 += adapter.getPoint2(indices[i]);
  }

  pointsCenter1 = pointsCenter1 / numberCorrespondences;
  pointsCenter2 = pointsCenter2 / numberCorrespondences;

  //compute the matrix H = sum(f'*f^{T})
  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    Eigen::Vector3d f = adapter.getPoint1(indices[i]) - pointsCenter1;
    Eigen::Vector3d fprime = adapter.getPoint2(indices[i]) - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  //decompose this matrix (SVD) to obtain rotation
  rotation_t rotation = math::arun(Hcross);
  translation_t translation = pointsCenter1 - rotation*pointsCenter2;
  transformation_t solution;
  solution.block<3,3>(0,0) = rotation;
  solution.col(3) = translation;

  return solution;
}